

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_write_file(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char cVar1;
  vm_datatype_t *pvVar2;
  int iVar3;
  vm_val_t *pvVar4;
  
  if (getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_write_file::desc.min_argc_ = 1;
      getp_write_file::desc.opt_argc_ = 0;
      getp_write_file::desc.varargs_ = 0;
      __cxa_guard_release(&getp_write_file(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_write_file::desc);
  pvVar4 = sp_;
  if (iVar3 == 0) {
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar4->val).obj = self;
    check_valid_file(this);
    check_write_access(this);
    switch_read_write_mode(this,1);
    cVar1 = (this->super_CVmObject).ext_[0x14];
    if (cVar1 == '\x03') {
      CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_mode_exc,0,"wrong file mode");
    }
    pvVar4 = pvVar4 + -1;
    if (cVar1 == '\x02') {
      write_data_mode(this,pvVar4);
    }
    else if (cVar1 == '\x01') {
      write_text_mode(this,pvVar4);
    }
    sp_ = sp_ + -2;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_write_file(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    const vm_val_t *argval;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   get a pointer to the argument value, but leave it on the stack
     *   for now to protect against losing it in garbage collection 
     */
    argval = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* check that we have write access */
    check_write_access(vmg0_);

    /* deal with stdio buffering if we're changing modes */
    switch_read_write_mode(vmg_ TRUE);

    /* read according to our mode */
    switch(get_ext()->mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* read a line of text */
        write_text_mode(vmg_ argval);
        break;

    case VMOBJFILE_MODE_DATA:
        /* read in data mode */
        write_data_mode(vmg_ argval);
        break;

    case VMOBJFILE_MODE_RAW:
        /* can't use this call on this type of file */
        G_interpreter->throw_new_class(vmg_ G_predef->file_mode_exc,
                                       0, "wrong file mode");
        break;
    }

    /* discard our gc protection and argument */
    G_stk->discard(2);

    /* no return value - return nil by default */
    retval->set_nil();
    
    /* handled */
    return TRUE;
}